

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

void kratos::EventRemoval::process_block(StmtBlock *block)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  shared_ptr<kratos::Stmt> *stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_68 [24];
  shared_ptr<kratos::AuxiliaryStmt> aux;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  
  psVar1 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (lVar3 = 0;
      _Var4._M_pi = aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi, (long)psVar1 - (long)psVar2 >> 4 != lVar3; lVar3 = lVar3 + 1)
  {
    StmtBlock::get_stmt((StmtBlock *)local_68,(uint64_t)block);
    if (*(int *)(local_68._0_8_ + 0x78) == 0xd) {
      Stmt::as<kratos::AuxiliaryStmt>((Stmt *)(local_68 + 0x10));
      if (((pointer)(local_68._16_8_ + 0xa0))->second == 0) {
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>const&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<kratos::Stmt> *)local_68);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aux);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  }
  for (; _Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var4._M_pi = _Var4._M_pi + 1) {
    (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,_Var4._M_pi);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void process_block(StmtBlock *block) {
        auto stmt_count = block->size();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = block->get_stmt(i);
            if (stmt->type() == StatementType::Auxiliary) {
                auto aux = stmt->as<AuxiliaryStmt>();
                if (aux->aux_type() == AuxiliaryType::EventTracing)
                    stmts_to_remove.emplace_back(stmt);
            }
        }
        for (auto const &stmt : stmts_to_remove) {
            block->remove_stmt(stmt);
        }
    }